

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_cmap12_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  FT_Byte FVar3;
  FT_Byte FVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  if (valid->limit < table + 0x10) {
    ft_validator_error(valid,8);
  }
  uVar6 = *(uint *)(table + 4);
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  bVar1 = table[0xc];
  bVar2 = table[0xd];
  FVar3 = table[0xe];
  FVar4 = table[0xf];
  if (((uVar6 < 0x10) || ((ulong)((long)valid->limit - (long)table) < (ulong)uVar6)) ||
     ((uVar6 - 0x10) / 0xc <
      ((uint)CONCAT11(FVar3,FVar4) | (uint)((ulong)bVar2 << 0x10) | (uint)((ulong)bVar1 << 0x18))))
  {
    ft_validator_error(valid,8);
  }
  uVar6 = 0;
  for (lVar8 = 0;
      ((ulong)CONCAT11(FVar3,FVar4) | (ulong)bVar1 << 0x18 | (ulong)bVar2 << 0x10) * 0xc != lVar8;
      lVar8 = lVar8 + 0xc) {
    uVar5 = *(uint *)(table + 0x10 + lVar8);
    uVar9 = *(uint *)(table + lVar8 + 0x14);
    uVar7 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar5 = *(uint *)(table + lVar8 + 0x18);
    if (uVar9 < uVar7) {
      ft_validator_error(valid,8);
    }
    if ((lVar8 != 0) && (uVar7 <= uVar6)) {
      ft_validator_error(valid,8);
    }
    if ((valid->level != FT_VALIDATE_DEFAULT) &&
       ((uVar6 = (uint)valid[1].jump_buffer[0].__jmpbuf[0], uVar6 < uVar9 - uVar7 ||
        (uVar6 - (uVar9 - uVar7) <=
         (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18))))) {
      ft_validator_error(valid,0x10);
    }
    uVar6 = uVar9;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap12_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_groups;


    if ( table + 16 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 4;
    length = TT_NEXT_ULONG( p );

    p          = table + 12;
    num_groups = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 16 + 12 * num_groups ? */
         length < 16                                 ||
         ( length - 16 ) / 12 < num_groups           )
      FT_INVALID_TOO_SHORT;

    /* check groups, they must be in increasing order */
    {
      FT_ULong  n, start, end, start_id, last = 0;


      for ( n = 0; n < num_groups; n++ )
      {
        start    = TT_NEXT_ULONG( p );
        end      = TT_NEXT_ULONG( p );
        start_id = TT_NEXT_ULONG( p );

        if ( start > end )
          FT_INVALID_DATA;

        if ( n > 0 && start <= last )
          FT_INVALID_DATA;

        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_UInt32  d = end - start;


          /* start_id + end - start >= TT_VALID_GLYPH_COUNT( valid ) ? */
          if ( d > TT_VALID_GLYPH_COUNT( valid )             ||
               start_id >= TT_VALID_GLYPH_COUNT( valid ) - d )
            FT_INVALID_GLYPH_ID;
        }

        last = end;
      }
    }

    return FT_Err_Ok;
  }